

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EfcFlash.cpp
# Opt level: O2

void __thiscall EfcFlash::waitFSR(EfcFlash *this,int seconds)

{
  uint32_t uVar1;
  uint uVar2;
  undefined8 *puVar3;
  pointer_____offset_0x10___ *ppuVar4;
  int iVar5;
  
  iVar5 = seconds * 1000;
  uVar2 = 1;
  do {
    if (iVar5 < 1) {
      return;
    }
    uVar1 = readFSR0(this);
    if ((uVar1 & 2) != 0) {
LAB_0010d43f:
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = &PTR__exception_001177c8;
      ppuVar4 = &FlashCmdError::typeinfo;
LAB_0010d473:
      __cxa_throw(puVar3,ppuVar4,std::exception::~exception);
    }
    if ((uVar1 & 4) != 0) {
LAB_0010d45a:
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = &PTR__exception_00117a30;
      ppuVar4 = &FlashLockError::typeinfo;
      goto LAB_0010d473;
    }
    if ((this->super_Flash)._planes == 2) {
      uVar2 = readFSR1(this);
      if ((uVar2 & 2) != 0) goto LAB_0010d43f;
      if ((uVar2 & 4) != 0) goto LAB_0010d45a;
    }
    if ((uVar1 & uVar2 & 1) != 0) {
      if (iVar5 != 1) {
        return;
      }
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = &PTR__exception_00117a58;
      ppuVar4 = &FlashTimeoutError::typeinfo;
      goto LAB_0010d473;
    }
    usleep(1000);
    iVar5 = iVar5 + -1;
  } while( true );
}

Assistant:

void
EfcFlash::waitFSR(int seconds)
{
    int tries = seconds * 1000;
    uint32_t fsr0;
    uint32_t fsr1 = 0x1;

    while (tries-- > 0)
    {
        fsr0 = readFSR0();
        if (fsr0 & 0x2)
            throw FlashCmdError();
        if (fsr0 & 0x4)
            throw FlashLockError();

        if (_planes == 2)
        {
            fsr1 = readFSR1();
            if (fsr1 & 0x2)
                throw FlashCmdError();
            if (fsr1 & 0x4)
                throw FlashLockError();
        }
        if (fsr0 & fsr1 & 0x1)
            break;
        usleep(1000);
    }
    if (tries == 0)
        throw FlashTimeoutError();
}